

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int ffcdfl(fitsfile *fptr,int *status)

{
  int iVar1;
  int iVar2;
  long bytepos;
  char local_b78 [8];
  char chbuff [2880];
  char chfill;
  LONGLONG filpos;
  int i;
  int nfill;
  int *status_local;
  fitsfile *fptr_local;
  
  if (*status < 1) {
    if (fptr->HDUposition != fptr->Fptr->curhdu) {
      ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
    }
    if (fptr->Fptr->heapstart == 0) {
      fptr_local._4_4_ = *status;
    }
    else {
      bytepos = fptr->Fptr->datastart + fptr->Fptr->heapstart + fptr->Fptr->heapsize;
      iVar1 = (int)((bytepos + 0xb3f) / 0xb40) * 0xb40 - (int)bytepos;
      if (iVar1 == 0) {
        fptr_local._4_4_ = *status;
      }
      else {
        ffmbyt(fptr,bytepos,0,status);
        iVar2 = ffgbyt(fptr,(long)iVar1,local_b78,status);
        if (iVar2 < 1) {
          if (fptr->Fptr->hdutype == 1) {
            chbuff[0xb3f] = ' ';
          }
          else {
            chbuff[0xb3f] = '\0';
          }
          for (filpos._0_4_ = 0; (int)filpos < iVar1; filpos._0_4_ = (int)filpos + 1) {
            if (local_b78[(int)filpos] != chbuff[0xb3f]) {
              *status = 0xff;
              if (fptr->Fptr->hdutype == 1) {
                ffpmsg(
                      "Warning: remaining bytes following ASCII table data are not filled with blanks."
                      );
              }
              else {
                ffpmsg("Warning: remaining bytes following data are not filled with zeros.");
              }
              return *status;
            }
          }
          fptr_local._4_4_ = *status;
        }
        else {
          ffpmsg("Error reading data unit fill bytes (ffcdfl).");
          fptr_local._4_4_ = *status;
        }
      }
    }
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffcdfl( fitsfile *fptr, int *status)
{
   int nfill,i;
   LONGLONG filpos;
   char chfill,chbuff[2880];

   if( *status > 0 ) return( *status );

    /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

   /*   check if the data unit is null   */
   if( (fptr->Fptr)->heapstart==0 ) return( *status );

   /* calculate starting position of the fill bytes, if any */
   filpos = (fptr->Fptr)->datastart 
          + (fptr->Fptr)->heapstart 
          + (fptr->Fptr)->heapsize;

   /*   calculate the number of fill bytes   */
   nfill = (long) ((filpos + 2879) / 2880 * 2880 - filpos);
   if( nfill == 0 ) return( *status );

   /*   move to the beginning of the fill bytes   */
   ffmbyt(fptr, filpos, FALSE, status);

   if( ffgbyt(fptr, nfill, chbuff, status) > 0)
   {
      ffpmsg("Error reading data unit fill bytes (ffcdfl).");
      return( *status );
   }

   if( (fptr->Fptr)->hdutype==ASCII_TBL )
      chfill = 32;         /* ASCII tables are filled with spaces */
   else
      chfill = 0;          /* all other extensions are filled with zeros */
   
   /*   check for all zeros or blanks   */
   
   for(i=0;i<nfill;i++) {
      if( chbuff[i] != chfill ) {
         *status=BAD_DATA_FILL;
         if( (fptr->Fptr)->hdutype==ASCII_TBL )
            ffpmsg("Warning: remaining bytes following ASCII table data are not filled with blanks.");
         else
            ffpmsg("Warning: remaining bytes following data are not filled with zeros.");
         return( *status );
      }
   }
   return( *status );
}